

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O3

void PrintSwitchStmt(FLispString *out,ZCC_TreeNode *node)

{
  FLispString::Break(out);
  FLispString::Open(out,"switch-stmt");
  PrintNodes(out,node[1].SiblingNext,true,false);
  FLispString::Break(out);
  PrintNodes(out,node[1].SiblingPrev,false,false);
  FLispString::Close(out);
  return;
}

Assistant:

static void PrintSwitchStmt(FLispString &out, ZCC_TreeNode *node)
{
	ZCC_SwitchStmt *snode = (ZCC_SwitchStmt *)node;
	out.Break();
	out.Open("switch-stmt");
	PrintNodes(out, snode->Condition);
	out.Break();
	PrintNodes(out, snode->Content, false);
	out.Close();
}